

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QString * __thiscall QWidget::windowTitle(QWidget *this)

{
  bool bVar1;
  QWidgetPrivate *a;
  pointer pQVar2;
  QStringBuilder<QString,_QLatin1String> *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  QStringBuilder<QString,_QLatin1String> *b;
  QFileInfo local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  b = in_RDI;
  a = d_func((QWidget *)0x37145c);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x37146f);
  if (bVar1) {
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x371486);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x371492);
    if (bVar1) {
      std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3714a9);
      std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::operator->
                ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x3714b5);
      bVar1 = QString::isEmpty((QString *)0x3714c1);
      if (!bVar1) {
        std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                  ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3714d3);
        std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::operator->
                  ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x3714df);
        QString::QString(&b->a,&in_RDI->a);
        goto LAB_003715c4;
      }
      std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x371502);
      std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::operator->
                ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x37150e);
      bVar1 = QString::isEmpty((QString *)0x37151a);
      if (!bVar1) {
        std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                  ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x371530);
        pQVar2 = std::unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_>::operator->
                           ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x37153c);
        QFileInfo::QFileInfo(local_50,(QString *)&pQVar2->filePath);
        QFileInfo::fileName();
        Qt::Literals::StringLiterals::operator____L1((char *)a,(size_t)b);
        ::operator+((QString *)a,(QLatin1String *)b);
        ::QStringBuilder::operator_cast_to_QString(in_RDI);
        QStringBuilder<QString,_QLatin1String>::~QStringBuilder
                  ((QStringBuilder<QString,_QLatin1String> *)0x3715a3);
        QString::~QString((QString *)0x3715ad);
        QFileInfo::~QFileInfo(local_50);
        goto LAB_003715c4;
      }
    }
  }
  QString::QString((QString *)0x3715c4);
LAB_003715c4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return &b->a;
}

Assistant:

QString QWidget::windowTitle() const
{
    Q_D(const QWidget);
    if (d->extra && d->extra->topextra) {
        if (!d->extra->topextra->caption.isEmpty())
            return d->extra->topextra->caption;
        if (!d->extra->topextra->filePath.isEmpty())
            return QFileInfo(d->extra->topextra->filePath).fileName() + "[*]"_L1;
    }
    return QString();
}